

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient3dexact(double *pa,double *pb,double *pc,double *pd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double bc [4];
  double bd [4];
  double ac [4];
  double cd [4];
  double ab [4];
  double temp8 [8];
  double da [4];
  double dab [12];
  double cda [12];
  double abc [12];
  double cdet [24];
  double bdet [24];
  double adet [24];
  double bcd [12];
  double ddet [24];
  double deter [96];
  double cddet [48];
  double abdet [48];
  double local_bb8;
  double local_bb0;
  double local_ba8;
  double local_ba0;
  double local_b98 [4];
  double local_b78 [4];
  double local_b58;
  double local_b50;
  double local_b48;
  double local_b40;
  double local_b38;
  double local_b30;
  double local_b28;
  double local_b20;
  double local_b18 [8];
  double local_ad8;
  double local_ad0;
  double local_ac8;
  double local_ac0;
  double local_ab8 [12];
  double local_a58 [12];
  double local_9f8 [12];
  double local_998 [24];
  double local_8d8 [24];
  double local_818 [24];
  double local_758 [12];
  double local_6f8 [23];
  double adStack_640 [97];
  double local_338 [48];
  double local_1b8 [49];
  
  dVar9 = *pb;
  dVar10 = pb[1];
  dVar27 = *pa;
  dVar28 = pa[1];
  dVar8 = dVar27 * dVar10;
  dVar13 = dVar27 * splitter - (dVar27 * splitter - dVar27);
  dVar6 = dVar27 - dVar13;
  dVar18 = dVar10 * splitter - (dVar10 * splitter - dVar10);
  dVar20 = dVar10 - dVar18;
  dVar11 = dVar6 * dVar20 - (((dVar8 - dVar13 * dVar18) - dVar6 * dVar18) - dVar13 * dVar20);
  dVar7 = dVar9 * dVar28;
  dVar25 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar30 = splitter * dVar28 - (splitter * dVar28 - dVar28);
  dVar22 = dVar9 - dVar25;
  dVar23 = dVar28 - dVar30;
  dVar14 = dVar22 * dVar23 - (((dVar7 - dVar25 * dVar30) - dVar22 * dVar30) - dVar25 * dVar23);
  dVar15 = dVar11 - dVar14;
  local_b38 = (dVar11 - (dVar15 + (dVar11 - dVar15))) + ((dVar11 - dVar15) - dVar14);
  dVar11 = dVar8 + dVar15;
  dVar8 = (dVar8 - (dVar11 - (dVar11 - dVar8))) + (dVar15 - (dVar11 - dVar8));
  dVar14 = dVar8 - dVar7;
  local_b30 = (dVar8 - (dVar14 + (dVar8 - dVar14))) + ((dVar8 - dVar14) - dVar7);
  local_b20 = dVar11 + dVar14;
  local_b28 = (dVar11 - (local_b20 - (local_b20 - dVar11))) + (dVar14 - (local_b20 - dVar11));
  dVar7 = pc[1];
  dVar16 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar12 = dVar9 * dVar7;
  dVar29 = dVar7 - dVar16;
  dVar11 = dVar22 * dVar29 - (((dVar12 - dVar25 * dVar16) - dVar22 * dVar16) - dVar25 * dVar29);
  dVar8 = *pc;
  dVar19 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar17 = dVar10 * dVar8;
  dVar15 = dVar8 - dVar19;
  dVar14 = dVar15 * dVar20 - (((dVar17 - dVar19 * dVar18) - dVar15 * dVar18) - dVar19 * dVar20);
  dVar26 = dVar11 - dVar14;
  local_bb8 = (dVar11 - (dVar26 + (dVar11 - dVar26))) + ((dVar11 - dVar26) - dVar14);
  dVar14 = dVar12 + dVar26;
  dVar12 = (dVar12 - (dVar14 - (dVar14 - dVar12))) + (dVar26 - (dVar14 - dVar12));
  dVar11 = dVar12 - dVar17;
  local_bb0 = (dVar12 - (dVar11 + (dVar12 - dVar11))) + ((dVar12 - dVar11) - dVar17);
  local_ba0 = dVar14 + dVar11;
  local_ba8 = (dVar14 - (local_ba0 - (local_ba0 - dVar14))) + (dVar11 - (local_ba0 - dVar14));
  dVar11 = pd[1];
  dVar31 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar12 = dVar28 * dVar8;
  dVar8 = dVar8 * dVar11;
  dVar24 = dVar27 * dVar11;
  dVar9 = dVar9 * dVar11;
  dVar11 = dVar11 - dVar31;
  dVar26 = dVar15 * dVar11 - (((dVar8 - dVar19 * dVar31) - dVar15 * dVar31) - dVar19 * dVar11);
  dVar14 = *pd;
  dVar32 = splitter * dVar14 - (splitter * dVar14 - dVar14);
  dVar27 = dVar27 * dVar7;
  dVar7 = dVar7 * dVar14;
  dVar28 = dVar28 * dVar14;
  dVar10 = dVar10 * dVar14;
  dVar14 = dVar14 - dVar32;
  dVar21 = dVar14 * dVar29 - (((dVar7 - dVar32 * dVar16) - dVar14 * dVar16) - dVar32 * dVar29);
  dVar17 = dVar26 - dVar21;
  local_b58 = (dVar26 - (dVar17 + (dVar26 - dVar17))) + ((dVar26 - dVar17) - dVar21);
  dVar26 = dVar8 + dVar17;
  dVar17 = (dVar8 - (dVar26 - (dVar26 - dVar8))) + (dVar17 - (dVar26 - dVar8));
  dVar8 = dVar17 - dVar7;
  local_b50 = (dVar17 - (dVar8 + (dVar17 - dVar8))) + ((dVar17 - dVar8) - dVar7);
  local_b40 = dVar26 + dVar8;
  local_b48 = (dVar26 - (local_b40 - (local_b40 - dVar26))) + (dVar8 - (local_b40 - dVar26));
  dVar8 = dVar14 * dVar23 - (((dVar28 - dVar32 * dVar30) - dVar14 * dVar30) - dVar32 * dVar23);
  dVar17 = dVar6 * dVar11 - (((dVar24 - dVar13 * dVar31) - dVar6 * dVar31) - dVar13 * dVar11);
  dVar7 = dVar8 - dVar17;
  local_ad8 = (dVar8 - (dVar7 + (dVar8 - dVar7))) + ((dVar8 - dVar7) - dVar17);
  dVar8 = dVar28 + dVar7;
  dVar7 = (dVar28 - (dVar8 - (dVar8 - dVar28))) + (dVar7 - (dVar8 - dVar28));
  dVar28 = dVar7 - dVar24;
  local_ad0 = (dVar7 - (dVar28 + (dVar7 - dVar28))) + ((dVar7 - dVar28) - dVar24);
  local_ac0 = dVar8 + dVar28;
  local_ac8 = (dVar8 - (local_ac0 - (local_ac0 - dVar8))) + (dVar28 - (local_ac0 - dVar8));
  dVar8 = dVar29 * dVar6 - (((dVar27 - dVar13 * dVar16) - dVar16 * dVar6) - dVar13 * dVar29);
  dVar7 = dVar15 * dVar23 - (((dVar12 - dVar19 * dVar30) - dVar30 * dVar15) - dVar19 * dVar23);
  dVar28 = dVar8 - dVar7;
  local_b78[0] = (dVar8 - (dVar28 + (dVar8 - dVar28))) + ((dVar8 - dVar28) - dVar7);
  dVar7 = dVar27 + dVar28;
  dVar28 = (dVar27 - (dVar7 - (dVar7 - dVar27))) + (dVar28 - (dVar7 - dVar27));
  dVar27 = dVar28 - dVar12;
  local_b78[1] = (dVar28 - (dVar27 + (dVar28 - dVar27))) + ((dVar28 - dVar27) - dVar12);
  local_b78[3] = dVar7 + dVar27;
  local_b78[2] = (dVar7 - (local_b78[3] - (local_b78[3] - dVar7))) +
                 (dVar27 - (local_b78[3] - dVar7));
  dVar27 = dVar11 * dVar22 - (((dVar9 - dVar25 * dVar31) - dVar31 * dVar22) - dVar25 * dVar11);
  dVar7 = dVar14 * dVar20 - (((dVar10 - dVar32 * dVar18) - dVar18 * dVar14) - dVar32 * dVar20);
  dVar28 = dVar27 - dVar7;
  local_b98[0] = (dVar27 - (dVar28 + (dVar27 - dVar28))) + ((dVar27 - dVar28) - dVar7);
  dVar27 = dVar9 + dVar28;
  dVar28 = (dVar9 - (dVar27 - (dVar27 - dVar9))) + (dVar28 - (dVar27 - dVar9));
  dVar9 = dVar28 - dVar10;
  local_b98[1] = (dVar28 - (dVar9 + (dVar28 - dVar9))) + ((dVar28 - dVar9) - dVar10);
  local_b98[3] = dVar27 + dVar9;
  local_b98[2] = (dVar27 - (local_b98[3] - (local_b98[3] - dVar27))) +
                 (dVar9 - (local_b98[3] - dVar27));
  iVar1 = fast_expansion_sum_zeroelim(4,&local_b58,4,&local_ad8,local_b18);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_b18,4,local_b78,local_a58);
  iVar2 = fast_expansion_sum_zeroelim(4,&local_ad8,4,&local_b38,local_b18);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_b18,4,local_b98,local_ab8);
  lVar5 = 0;
  do {
    local_b98[lVar5] = -local_b98[lVar5];
    local_b78[lVar5] = -local_b78[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  iVar3 = fast_expansion_sum_zeroelim(4,&local_b38,4,&local_bb8,local_b18);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_b18,4,local_b78,local_9f8);
  iVar4 = fast_expansion_sum_zeroelim(4,&local_bb8,4,&local_b58,local_b18);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_b18,4,local_b98,local_758);
  iVar4 = scale_expansion_zeroelim(iVar4,local_758,pa[2],local_818);
  iVar1 = scale_expansion_zeroelim(iVar1,local_a58,-pb[2],local_8d8);
  iVar2 = scale_expansion_zeroelim(iVar2,local_ab8,pc[2],local_998);
  iVar3 = scale_expansion_zeroelim(iVar3,local_9f8,-pd[2],local_6f8);
  iVar1 = fast_expansion_sum_zeroelim(iVar4,local_818,iVar1,local_8d8,local_1b8);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_998,iVar3,local_6f8,local_338);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_1b8,iVar2,local_338,adStack_640 + 1);
  return adStack_640[iVar1];
}

Assistant:

REAL orient3dexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL adet[24], bdet[24], cdet[24], ddet[24];
  int alen, blen, clen, dlen;
  REAL abdet[48], cddet[48];
  int ablen, cdlen;
  REAL deter[96];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  alen = scale_expansion_zeroelim(bcdlen, bcd, pa[2], adet);
  blen = scale_expansion_zeroelim(cdalen, cda, -pb[2], bdet);
  clen = scale_expansion_zeroelim(dablen, dab, pc[2], cdet);
  dlen = scale_expansion_zeroelim(abclen, abc, -pd[2], ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}